

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_artifact_effect_yx(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  long *local_28;
  effect *effect;
  artifact *a;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  local_28 = *(long **)((long)pvVar2 + 0x110);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (local_28 == (long *)0x0) {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    for (; *local_28 != 0; local_28 = (long *)*local_28) {
    }
    wVar1 = parser_getint(p,"y");
    *(wchar_t *)(local_28 + 3) = wVar1;
    wVar1 = parser_getint(p,"x");
    *(wchar_t *)((long)local_28 + 0x1c) = wVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_artifact_effect_yx(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct effect *effect = a->effect;

	if (!a)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* If there is no effect, assume that this is human and not parser error. */
	if (effect == NULL)
		return PARSE_ERROR_NONE;

	while (effect->next) effect = effect->next;
	effect->y = parser_getint(p, "y");
	effect->x = parser_getint(p, "x");

	return PARSE_ERROR_NONE;
}